

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_manager.h
# Opt level: O1

void __thiscall
miniros::TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>::
TimerQueueCallback::~TimerQueueCallback(TimerQueueCallback *this)

{
  _Atomic_word *p_Var1;
  int iVar2;
  element_type *peVar3;
  int iVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  bool bVar6;
  
  (this->super_CallbackInterface)._vptr_CallbackInterface =
       (_func_int **)&PTR__TimerQueueCallback_002ac9e0;
  p_Var5 = (this->info_).
           super___weak_ptr<miniros::TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>::TimerInfo,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar4 = p_Var5->_M_use_count;
    do {
      if (iVar4 == 0) {
        p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar2 = p_Var5->_M_use_count;
      bVar6 = iVar4 == iVar2;
      if (bVar6) {
        p_Var5->_M_use_count = iVar4 + 1;
        iVar2 = iVar4;
      }
      iVar4 = iVar2;
      UNLOCK();
    } while (!bVar6);
  }
  if (p_Var5 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar6 = true;
  }
  else {
    bVar6 = p_Var5->_M_use_count == 0;
  }
  peVar3 = (this->info_).
           super___weak_ptr<miniros::TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>::TimerInfo,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (!(bool)(peVar3 == (element_type *)0x0 | bVar6)) {
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)&peVar3->waiting_mutex);
    if (iVar4 != 0) {
      std::__throw_system_error(iVar4);
    }
    peVar3->waiting_callbacks = peVar3->waiting_callbacks - 1;
    pthread_mutex_unlock((pthread_mutex_t *)&peVar3->waiting_mutex);
  }
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  p_Var5 = (this->info_).
           super___weak_ptr<miniros::TimerManager<miniros::SteadyTime,_miniros::WallDuration,_miniros::SteadyTimerEvent>::TimerInfo,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var5->_M_weak_count;
      iVar4 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar4 = p_Var5->_M_weak_count;
      p_Var5->_M_weak_count = iVar4 + -1;
    }
    if (iVar4 == 1) {
      (*p_Var5->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

~TimerQueueCallback()
    {
      TimerInfoPtr info = info_.lock();
      if (info)
      {
        std::scoped_lock<std::mutex> lock(info->waiting_mutex);
        --info->waiting_callbacks;
      }
    }